

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::initializeFaceTree(btSoftBody *this)

{
  Face *data;
  Node *pNVar1;
  int i;
  long lVar2;
  btDbvtNode *pbVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  btDbvtVolume vol;
  btDbvtVolume local_68;
  btVector3 *apbStack_48 [3];
  
  btDbvt::clear(&this->m_fdbvt);
  if (0 < (this->m_faces).m_size) {
    lVar4 = 0;
    do {
      data = (this->m_faces).m_data + lVar4;
      pNVar1 = data->m_n[0];
      apbStack_48[1] = &data->m_n[1]->m_x;
      apbStack_48[2] = &data->m_n[2]->m_x;
      local_68.mi.m_floats = *&(pNVar1->m_x).m_floats;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(pNVar1->m_x).m_floats;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)((pNVar1->m_x).m_floats + 2);
      lVar2 = 1;
      do {
        auVar5 = *(undefined1 (*) [16])apbStack_48[lVar2]->m_floats;
        local_68.mi.m_floats = (btScalar  [4])minps(auVar5,local_68.mi.m_floats);
        auVar7 = maxps(auVar5,auVar7);
        auVar5._0_8_ = auVar5._8_8_;
        auVar6 = maxps(auVar5,auVar6);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      local_68.mx.m_floats[0] = auVar7._0_4_ + 0.0;
      local_68.mx.m_floats[1] = auVar7._4_4_ + 0.0;
      local_68.mx.m_floats[3] = auVar6._4_4_;
      local_68.mx.m_floats[2] = auVar6._0_4_ + 0.0;
      pbVar3 = btDbvt::insert(&this->m_fdbvt,&local_68,data);
      data->m_leaf = pbVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->m_faces).m_size);
  }
  return;
}

Assistant:

void			btSoftBody::initializeFaceTree()
{
	m_fdbvt.clear();
	for(int i=0;i<m_faces.size();++i)
	{
		Face&	f=m_faces[i];
		f.m_leaf=m_fdbvt.insert(VolumeOf(f,0),&f);
	}
}